

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<NULLC::Range,_false,_false>::grow_and_add
          (FastVector<NULLC::Range,_false,_false> *this,uint newSize,Range *val)

{
  uint uVar1;
  uint uVar2;
  Range *ptr;
  Range *pRVar3;
  uint oldMax;
  Range *oldData;
  Range *val_local;
  uint newSize_local;
  FastVector<NULLC::Range,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pRVar3 = this->data;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  pRVar3[uVar2].start = val->start;
  pRVar3[uVar2].end = val->end;
  if (ptr != (Range *)0x0) {
    NULLC::destruct<NULLC::Range>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}